

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImVec2 ImGui::NavCalcPreferredRefPos(void)

{
  ImVec2 *mouse_pos;
  ImGuiWindow *window;
  ImGuiContext *pIVar1;
  bool bVar2;
  ImGuiViewport *pIVar3;
  ImVec2 *pIVar4;
  ImVec2 IVar6;
  ImVec2 IVar5;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  float fVar9;
  float fVar10;
  float in_XMM1_Dc;
  float in_XMM1_Dd;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  ImRect IVar19;
  ImVec2 local_18;
  
  pIVar1 = GImGui;
  if ((GImGui->NavDisableHighlight == false) &&
     (window = GImGui->NavWindow, (GImGui->NavDisableMouseHover & window != (ImGuiWindow *)0x0) != 0
     )) {
    IVar19 = WindowRectRelToAbs(window,window->NavRectRel + GImGui->NavLayer);
    fVar9 = IVar19.Max.x;
    fVar10 = IVar19.Max.y;
    fVar15 = IVar19.Min.x;
    fVar16 = IVar19.Min.y;
    fVar17 = (float)extraout_XMM0_Qb;
    fVar18 = (float)((ulong)extraout_XMM0_Qb >> 0x20);
    if ((window->LastFrameActive != pIVar1->FrameCount) &&
       ((((fVar11 = (window->ScrollTarget).x, fVar11 != 3.4028235e+38 || (NAN(fVar11))) ||
         (fVar11 = (window->ScrollTarget).y, fVar11 != 3.4028235e+38)) || (NAN(fVar11))))) {
      IVar5 = CalcNextScrollFromScrollTargetAndClamp(window);
      fVar11 = (window->Scroll).x - IVar5.x;
      fVar12 = (window->Scroll).y - IVar5.y;
      fVar13 = 0.0 - (float)extraout_XMM0_Qb_00;
      fVar14 = 0.0 - (float)((ulong)extraout_XMM0_Qb_00 >> 0x20);
      fVar15 = fVar15 + fVar11;
      fVar16 = fVar16 + fVar12;
      fVar17 = fVar17 + fVar13;
      fVar18 = fVar18 + fVar14;
      fVar9 = fVar9 + fVar11;
      fVar10 = fVar10 + fVar12;
      in_XMM1_Dc = in_XMM1_Dc + fVar13;
      in_XMM1_Dd = in_XMM1_Dd + fVar14;
    }
    auVar7._0_4_ = (pIVar1->Style).FramePadding.x * 4.0;
    auVar7._4_4_ = (pIVar1->Style).FramePadding.y;
    auVar7._8_8_ = 0;
    auVar8._4_4_ = fVar10 - fVar16;
    auVar8._0_4_ = fVar9 - fVar15;
    auVar8._8_4_ = in_XMM1_Dc - fVar17;
    auVar8._12_4_ = in_XMM1_Dd - fVar18;
    auVar8 = minps(auVar7,auVar8);
    local_18.y = fVar10 - auVar8._4_4_;
    local_18.x = fVar15 + auVar8._0_4_;
    pIVar3 = GetMainViewport();
    IVar6.x = (pIVar3->Size).x + (pIVar3->Pos).x;
    IVar6.y = (pIVar3->Size).y + (pIVar3->Pos).y;
    IVar6 = ImClamp(&local_18,&pIVar3->Pos,IVar6);
    IVar5.x = (float)(int)IVar6.x;
    IVar5.y = (float)(int)IVar6.y;
  }
  else {
    mouse_pos = &(GImGui->IO).MousePos;
    bVar2 = IsMousePosValid(mouse_pos);
    pIVar4 = &pIVar1->MouseLastValidPos;
    if (bVar2) {
      pIVar4 = mouse_pos;
    }
    IVar5.x = pIVar4->x + 1.0;
    IVar5.y = pIVar4->y;
  }
  return IVar5;
}

Assistant:

static ImVec2 ImGui::NavCalcPreferredRefPos()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.NavWindow;
    if (g.NavDisableHighlight || !g.NavDisableMouseHover || !window)
    {
        // Mouse (we need a fallback in case the mouse becomes invalid after being used)
        // The +1.0f offset when stored by OpenPopupEx() allows reopening this or another popup (same or another mouse button) while not moving the mouse, it is pretty standard.
        // In theory we could move that +1.0f offset in OpenPopupEx()
        ImVec2 p = IsMousePosValid(&g.IO.MousePos) ? g.IO.MousePos : g.MouseLastValidPos;
        return ImVec2(p.x + 1.0f, p.y);
    }
    else
    {
        // When navigation is active and mouse is disabled, pick a position around the bottom left of the currently navigated item
        // Take account of upcoming scrolling (maybe set mouse pos should be done in EndFrame?)
        ImRect rect_rel = WindowRectRelToAbs(window, window->NavRectRel[g.NavLayer]);
        if (window->LastFrameActive != g.FrameCount && (window->ScrollTarget.x != FLT_MAX || window->ScrollTarget.y != FLT_MAX))
        {
            ImVec2 next_scroll = CalcNextScrollFromScrollTargetAndClamp(window);
            rect_rel.Translate(window->Scroll - next_scroll);
        }
        ImVec2 pos = ImVec2(rect_rel.Min.x + ImMin(g.Style.FramePadding.x * 4, rect_rel.GetWidth()), rect_rel.Max.y - ImMin(g.Style.FramePadding.y, rect_rel.GetHeight()));
        ImGuiViewport* viewport = GetMainViewport();
        return ImFloor(ImClamp(pos, viewport->Pos, viewport->Pos + viewport->Size)); // ImFloor() is important because non-integer mouse position application in backend might be lossy and result in undesirable non-zero delta.
    }
}